

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O2

void __thiscall
SemanticAnalyserTest_FunctionResultCallWorks_Test::TestBody
          (SemanticAnalyserTest_FunctionResultCallWorks_Test *this)

{
  string source;
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "\n  fn f(x: f32): function\n  {\n    ret \\(m: f32): f32 = { ret x*m; };\n  }\n  \n  fn main(): f32\n  {\n    f(1)(23);\n    ret 0;\n  }\n  "
             ,&local_29);
  nothrowTest(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, FunctionResultCallWorks)
{
  std::string source = R"SRC(
  fn f(x: f32): function
  {
    ret \(m: f32): f32 = { ret x*m; };
  }
  
  fn main(): f32
  {
    f(1)(23);
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}